

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cFramebufferNoAttachmentsTests.cpp
# Opt level: O0

void __thiscall
glcts::FramebufferNoAttachmentsApiCase::begin_fbo
          (FramebufferNoAttachmentsApiCase *this,GLenum target,uint test_case)

{
  uint test_case_local;
  GLenum target_local;
  FramebufferNoAttachmentsApiCase *this_local;
  
  if (test_case == 0) {
    begin_fbo_no_attachments(this,target);
  }
  else if (test_case == 1) {
    begin_fbo_with_multisample_renderbuffer(this,target);
  }
  return;
}

Assistant:

void FramebufferNoAttachmentsApiCase::begin_fbo(GLenum target, unsigned test_case)
{
	switch (test_case)
	{
	case 0:
		begin_fbo_no_attachments(target);
		break;
	case 1:
		begin_fbo_with_multisample_renderbuffer(target);
		break;
	}
}